

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O0

void leveldb::_Test_GetPicksCorrectFile::_RunIt(void)

{
  undefined1 local_a8 [8];
  _Test_GetPicksCorrectFile t;
  
  _Test_GetPicksCorrectFile((_Test_GetPicksCorrectFile *)local_a8);
  _Run((_Test_GetPicksCorrectFile *)local_a8);
  ~_Test_GetPicksCorrectFile((_Test_GetPicksCorrectFile *)local_a8);
  return;
}

Assistant:

TEST(DBTest, GetPicksCorrectFile) {
  do {
    // Arrange to have multiple files in a non-level-0 level.
    ASSERT_OK(Put("a", "va"));
    Compact("a", "b");
    ASSERT_OK(Put("x", "vx"));
    Compact("x", "y");
    ASSERT_OK(Put("f", "vf"));
    Compact("f", "g");
    ASSERT_EQ("va", Get("a"));
    ASSERT_EQ("vf", Get("f"));
    ASSERT_EQ("vx", Get("x"));
  } while (ChangeOptions());
}